

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int get_next_relative_field_bit_offset
              (coda_cursor *cursor,int64_t *rel_bit_offset,int64_t *current_field_size)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *message;
  coda_expression *expr;
  int available;
  int64_t bit_size;
  int local_344;
  coda_cursor local_340;
  
  lVar3 = (long)cursor->n;
  pcVar1 = cursor->stack[lVar3 + -2].type;
  lVar4 = (long)((int)cursor->stack[lVar3 + -1].index + 1);
  if ((long)pcVar1[4].definition <= lVar4) {
    __assert_fail("field_index < record->num_fields",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                  ,0xa1,
                  "int get_next_relative_field_bit_offset(const coda_cursor *, int64_t *, int64_t *)"
                 );
  }
  lVar4 = *(long *)(*(long *)(pcVar1 + 5) + lVar4 * 8);
  if (-1 < *(long *)(lVar4 + 0x28)) {
    *rel_bit_offset = *(long *)(lVar4 + 0x28);
    if (current_field_size != (int64_t *)0x0) {
      *current_field_size = -1;
      return 0;
    }
    return 0;
  }
  lVar3 = cursor->stack[lVar3 + -1].bit_offset - cursor->stack[lVar3 + -2].bit_offset;
  expr = *(coda_expression **)(lVar4 + 0x30);
  if (expr == (coda_expression *)0x0) {
    iVar2 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_340);
    if (iVar2 != 0) {
      return -1;
    }
    *rel_bit_offset = lVar3 + (long)local_340.product;
    if (current_field_size != (int64_t *)0x0) {
      *current_field_size = (int64_t)local_340.product;
      return 0;
    }
    return 0;
  }
  memcpy(&local_340,cursor,0x310);
  local_340.n = local_340.n + -1;
  if (current_field_size != (int64_t *)0x0) {
    *current_field_size = -1;
  }
  if (*(coda_expression **)(lVar4 + 0x20) != (coda_expression *)0x0) {
    iVar2 = coda_expression_eval_bool(*(coda_expression **)(lVar4 + 0x20),&local_340,&local_344);
    if (iVar2 != 0) {
      message = " for available expression";
      goto LAB_001830a2;
    }
    if (local_344 == 0) {
      *rel_bit_offset = lVar3;
      return 0;
    }
    expr = *(coda_expression **)(lVar4 + 0x30);
  }
  iVar2 = coda_expression_eval_integer(expr,&local_340,rel_bit_offset);
  if (iVar2 == 0) {
    return 0;
  }
  message = " for offset expression";
LAB_001830a2:
  coda_add_error_message(message);
  coda_cursor_add_to_error_message(cursor);
  return -1;
}

Assistant:

static int get_next_relative_field_bit_offset(const coda_cursor *cursor, int64_t *rel_bit_offset,
                                              int64_t *current_field_size)
{
    coda_type_record_field *field;
    coda_type_record *record;
    int64_t prev_bit_offset;
    int64_t bit_size;
    int field_index;

    record = (coda_type_record *)cursor->stack[cursor->n - 2].type;
    field_index = cursor->stack[cursor->n - 1].index + 1;
    assert(field_index < record->num_fields);
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }
        return 0;
    }

    prev_bit_offset = cursor->stack[cursor->n - 1].bit_offset - cursor->stack[cursor->n - 2].bit_offset;

    if (field->bit_offset_expr != NULL)
    {
        coda_cursor record_cursor;

        record_cursor = *cursor;
        record_cursor.n--;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }

        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                /* the size of this field is zero, so just use the offset of the previous field */
                *rel_bit_offset = prev_bit_offset;
                return 0;
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, &record_cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* determine offset by using bit_offset of current field and adding its bit size */
    if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    *rel_bit_offset = prev_bit_offset + bit_size;
    if (current_field_size != NULL)
    {
        *current_field_size = bit_size;
    }

    return 0;
}